

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::TagAliasRegistry::expandAliases
          (string *__return_storage_ptr__,TagAliasRegistry *this,string *unexpandedTestSpec)

{
  undefined8 *puVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  _Rb_tree_node_base *p_Var6;
  ulong *puVar7;
  ulong uVar8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  pcVar2 = (unexpandedTestSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + unexpandedTestSpec->_M_string_length);
  p_Var6 = (this->m_registry)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(this->m_registry)._M_t._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    lVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,*(ulong *)(p_Var6 + 1),0);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_b8,(ulong)__return_storage_ptr__);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_b8,*(ulong *)(p_Var6 + 2));
      local_50 = &local_40;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_40 = *puVar7;
        lStack_38 = plVar4[3];
      }
      else {
        local_40 = *puVar7;
        local_50 = (ulong *)*plVar4;
      }
      local_48 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_90,(ulong)__return_storage_ptr__);
      uVar8 = 0xf;
      if (local_50 != &local_40) {
        uVar8 = local_40;
      }
      if (uVar8 < (ulong)(local_88 + local_48)) {
        uVar8 = 0xf;
        if (local_90 != local_80) {
          uVar8 = local_80[0];
        }
        if (uVar8 < (ulong)(local_88 + local_48)) goto LAB_00135dc5;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_00135dc5:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
      }
      puVar1 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar1) {
        local_60 = *puVar1;
        uStack_58 = puVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar1;
        local_70 = (undefined8 *)*puVar5;
      }
      local_68 = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

std::string TagAliasRegistry::expandAliases(std::string const& unexpandedTestSpec) const {
		std::string expandedTestSpec = unexpandedTestSpec;
		for (std::map<std::string, TagAlias>::const_iterator it = m_registry.begin(), itEnd = m_registry.end();
			it != itEnd;
			++it) {
			std::size_t pos = expandedTestSpec.find(it->first);
			if (pos != std::string::npos) {
				expandedTestSpec = expandedTestSpec.substr(0, pos) +
					it->second.tag +
					expandedTestSpec.substr(pos + it->first.size());
			}
		}
		return expandedTestSpec;
	}